

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::CaptureByteCodeUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,OpCode opcode,uint32 offset)

{
  code *pcVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *pJVar5;
  JitArenaAllocator *pJVar6;
  BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  undefined1 local_78 [8];
  InstrByteCodeRegisterUses instrUses;
  TrackAllocData local_58;
  BVSparse<Memory::JitArenaAllocator> *local_30;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed;
  uint32 offset_local;
  OpCode opcode_local;
  Func *func_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  byteCodeUpwardExposedUsed._0_4_ = offset;
  byteCodeUpwardExposedUsed._6_2_ = opcode;
  _offset_local = func;
  func_local = (Func *)block;
  block_local = (BasicBlock *)this;
  bVar2 = DoCaptureByteCodeUpwardExposedUsed(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22f3,"(this->DoCaptureByteCodeUpwardExposedUsed())",
                       "this->DoCaptureByteCodeUpwardExposedUsed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_30 = GetByteCodeRegisterUpwardExposed
                       (this,(BasicBlock *)func_local,_offset_local,this->globOpt->alloc);
  BVSparse<Memory::JitArenaAllocator>::Minus
            (local_30,(BVSparse<Memory::JitArenaAllocator> *)func_local->ctorCachesByPropertyId);
  pJVar5 = Func::GetJITFunctionBody(_offset_local);
  RVar3 = JITTimeFunctionBody::GetEnvReg(pJVar5);
  this_00 = local_30;
  if (RVar3 != 0xffffffff) {
    pJVar5 = Func::GetJITFunctionBody(_offset_local);
    RVar3 = JITTimeFunctionBody::GetEnvReg(pJVar5);
    BVSparse<Memory::JitArenaAllocator>::Clear(this_00,RVar3);
  }
  if (_offset_local->byteCodeRegisterUses == (ByteCodeRegisterUses *)0x0) {
    pJVar6 = this->globOpt->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,
               (type_info *)
               &JsUtil::
                BaseDictionary<unsigned_int,Func::InstrByteCodeRegisterUses,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
               ,0x22fe);
    pJVar6 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar6,&local_58);
    instrUses.bv = (BVSparse<Memory::JitArenaAllocator> *)Memory::JitArenaAllocator::Alloc;
    this_01 = (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,pJVar6,0x4e98c0);
    JsUtil::
    BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_01,this->globOpt->alloc,0);
    _offset_local->byteCodeRegisterUses = this_01;
  }
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove
                    (_offset_local->byteCodeRegisterUses,(uint *)&byteCodeUpwardExposedUsed,
                     (InstrByteCodeRegisterUses *)local_78);
  if (bVar2) {
    if (local_78._0_2_ == Leave) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->globOpt->alloc,local_30);
      JsUtil::
      BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(_offset_local->byteCodeRegisterUses,(uint *)&byteCodeUpwardExposedUsed,
            (InstrByteCodeRegisterUses *)local_78);
      return;
    }
    BVSparse<Memory::JitArenaAllocator>::Or
              (local_30,(BVSparse<Memory::JitArenaAllocator> *)instrUses._0_8_);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->globOpt->alloc,(BVSparse<Memory::JitArenaAllocator> *)instrUses._0_8_);
  }
  local_78._0_2_ = byteCodeUpwardExposedUsed._6_2_;
  instrUses._0_8_ = local_30;
  JsUtil::
  BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(_offset_local->byteCodeRegisterUses,(uint *)&byteCodeUpwardExposedUsed,
        (InstrByteCodeRegisterUses *)local_78);
  return;
}

Assistant:

void
BackwardPass::CaptureByteCodeUpwardExposed(BasicBlock* block, Func* func, Js::OpCode opcode, uint32 offset)
{
    Assert(this->DoCaptureByteCodeUpwardExposedUsed());
    // Keep track of all the bytecode upward exposed after Backward's pass
    BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = GetByteCodeRegisterUpwardExposed(block, func, this->globOpt->alloc);
    byteCodeUpwardExposedUsed->Minus(block->excludeByteCodeUpwardExposedTracking);
    if (func->GetJITFunctionBody()->GetEnvReg() != Js::Constants::NoByteCodeOffset)
    {
        // No need to restore the environment so don't track it
        byteCodeUpwardExposedUsed->Clear(func->GetJITFunctionBody()->GetEnvReg());
    }
    if (!func->byteCodeRegisterUses)
    {
        func->byteCodeRegisterUses = JitAnew(this->globOpt->alloc, Func::ByteCodeRegisterUses, this->globOpt->alloc);
    }

    Func::InstrByteCodeRegisterUses instrUses;
    if (func->byteCodeRegisterUses->TryGetValueAndRemove(offset, &instrUses))
    {
        if (instrUses.capturingOpCode == Js::OpCode::Leave)
        {
            // Do not overwrite in the case of Leave
            JitAdelete(this->globOpt->alloc, byteCodeUpwardExposedUsed);
            func->byteCodeRegisterUses->Add(offset, instrUses);
            return;
        }
        byteCodeUpwardExposedUsed->Or(instrUses.bv);
        JitAdelete(this->globOpt->alloc, instrUses.bv);
    }

    instrUses.capturingOpCode = opcode;
    instrUses.bv = byteCodeUpwardExposedUsed;
    func->byteCodeRegisterUses->Add(offset, instrUses);
}